

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu510.c
# Opt level: O0

MPP_RET vepu510_h264e_use_pass1_patch(HalVepu510RegSet *regs,HalH264eVepu510Ctx *ctx)

{
  MppEncCfgSet *pMVar1;
  RK_U32 RVar2;
  uint uVar3;
  uint uVar4;
  RK_S32 c_stride;
  RK_S32 y_stride;
  RK_S32 fd_in;
  H264eVepu510Frame *reg_frm;
  MppEncPrepCfg *prep;
  HalH264eVepu510Ctx *ctx_local;
  HalVepu510RegSet *regs_local;
  
  pMVar1 = ctx->cfg;
  RVar2 = mpp_buffer_get_fd_with_caller(ctx->buf_pass1,"vepu510_h264e_use_pass1_patch");
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu510","enter\n","vepu510_h264e_use_pass1_patch");
  }
  (regs->reg_frm).common.src_fmt =
       (anon_struct_4_9_1f148558_for_src_fmt)
       ((uint)(regs->reg_frm).common.src_fmt & 0xffffffc3 | 0x18);
  (regs->reg_frm).common.src_fmt =
       (anon_struct_4_9_1f148558_for_src_fmt)((uint)(regs->reg_frm).common.src_fmt & 0xfffffffe);
  (regs->reg_frm).common.src_fmt =
       (anon_struct_4_9_1f148558_for_src_fmt)((uint)(regs->reg_frm).common.src_fmt & 0xfffffffd);
  (regs->reg_frm).common.src_fmt =
       (anon_struct_4_9_1f148558_for_src_fmt)
       ((uint)(regs->reg_frm).common.src_fmt & 0xffffff7f | 0x80);
  (regs->reg_frm).common.src_fmt =
       (anon_struct_4_9_1f148558_for_src_fmt)
       ((uint)(regs->reg_frm).common.src_fmt & 0xffffffbf | 0x40);
  uVar3 = (pMVar1->prep).width + 0xf;
  uVar4 = uVar3 & 0xfffffff0;
  (regs->reg_frm).common.src_strd0 =
       (anon_struct_4_2_9e7912bd_for_src_strd0)
       ((uint)(regs->reg_frm).common.src_strd0 & 0xffe00000 | uVar3 & 0x1ffff0);
  (regs->reg_frm).common.src_strd1 =
       (anon_struct_4_2_9e7912be_for_src_strd1)
       ((uint)(regs->reg_frm).common.src_strd1 & 0xffff0000 | uVar4 * 3 & 0xffff);
  (regs->reg_frm).common.src_proc =
       (anon_struct_4_8_0209085b_for_src_proc)((uint)(regs->reg_frm).common.src_proc & 0xfbffffff);
  (regs->reg_frm).common.src_proc =
       (anon_struct_4_8_0209085b_for_src_proc)((uint)(regs->reg_frm).common.src_proc & 0xe7ffffff);
  (regs->reg_frm).common.pic_ofst =
       (anon_struct_4_4_fd8500c5_for_pic_ofst)((uint)(regs->reg_frm).common.pic_ofst & 0xc000ffff);
  (regs->reg_frm).common.pic_ofst =
       (anon_struct_4_4_fd8500c5_for_pic_ofst)((uint)(regs->reg_frm).common.pic_ofst & 0xffffc000);
  (regs->reg_frm).common.adr_src0 = RVar2;
  (regs->reg_frm).common.adr_src1 = RVar2;
  (regs->reg_frm).common.adr_src2 = RVar2;
  mpp_dev_multi_offset_update(ctx->offsets,0xa1,uVar4 << 1);
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu510","leave\n","vepu510_h264e_use_pass1_patch");
  }
  return MPP_OK;
}

Assistant:

static MPP_RET vepu510_h264e_use_pass1_patch(HalVepu510RegSet *regs, HalH264eVepu510Ctx *ctx)
{
    MppEncPrepCfg *prep = &ctx->cfg->prep;
    H264eVepu510Frame *reg_frm = &regs->reg_frm;
    RK_S32 fd_in = mpp_buffer_get_fd(ctx->buf_pass1);
    RK_S32 y_stride;
    RK_S32 c_stride;

    hal_h264e_dbg_func("enter\n");

    reg_frm->common.src_fmt.src_cfmt   = VEPU541_FMT_YUV420SP;
    reg_frm->common.src_fmt.alpha_swap = 0;
    reg_frm->common.src_fmt.rbuv_swap  = 0;
    reg_frm->common.src_fmt.out_fmt    = 1;
    reg_frm->common.src_fmt.src_rcne   = 1;
    y_stride = MPP_ALIGN(prep->width, 16);
    c_stride = y_stride;

    reg_frm->common.src_strd0.src_strd0 = y_stride;
    reg_frm->common.src_strd1.src_strd1 = 3 * c_stride;

    reg_frm->common.src_proc.src_mirr   = 0;
    reg_frm->common.src_proc.src_rot    = 0;

    reg_frm->common.pic_ofst.pic_ofst_y = 0;
    reg_frm->common.pic_ofst.pic_ofst_x = 0;


    reg_frm->common.adr_src0   = fd_in;
    reg_frm->common.adr_src1   = fd_in;
    reg_frm->common.adr_src2   = fd_in;

    mpp_dev_multi_offset_update(ctx->offsets, 161, 2 * y_stride);

    hal_h264e_dbg_func("leave\n");
    return MPP_OK;
}